

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O3

void anon_unknown.dwarf_63b2::show(fp_t d)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  bitset<64UL> local_10;
  
  printf("%.18f\t");
  printf("0x%016lx\t",d);
  local_10.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)d;
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_10);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar1 + -0x18) + (char)pbVar1);
  std::ostream::put((char)pbVar1);
  std::ostream::flush();
  return;
}

Assistant:

void show(fp_t d)
{
    #ifdef FLEXFLOAT_ON_QUAD
    char buffer[128];
    quadmath_snprintf(buffer, sizeof buffer, "%.38Qf", d);
    printf("%s\t", buffer);
    #else
    printf(PRINTF_FORMAT "\t", d);
    #endif
    uint_t u = *((uint_t *) &d);
    #ifdef FLEXFLOAT_ON_SINGLE
    printf("0x%016x\t", u);
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    printf("0x%016lx\t", u);
    #endif
    std::cout << std::bitset<NUM_BITS>(u) << std::endl;
}